

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_vt_ref_t
flatcc_builder_create_cached_vtable
          (flatcc_builder_t *B,flatbuffers_voffset_t *vt,flatbuffers_voffset_t vt_size,
          uint32_t vt_hash)

{
  flatbuffers_uoffset_t fVar1;
  int iVar2;
  flatcc_builder_vt_ref_t fVar3;
  flatbuffers_uoffset_t *pfVar4;
  flatbuffers_uoffset_t *pfVar5;
  flatbuffers_voffset_t *__s2;
  flatcc_builder_vt_ref_t *pfVar6;
  void *__dest;
  flatbuffers_voffset_t *vt_;
  flatbuffers_uoffset_t next;
  flatbuffers_uoffset_t *pvd_head;
  flatbuffers_uoffset_t *pvd;
  vtable_descriptor_t *vd2;
  vtable_descriptor_t *vd;
  uint32_t vt_hash_local;
  flatbuffers_voffset_t vt_size_local;
  flatbuffers_voffset_t *vt_local;
  flatcc_builder_t *B_local;
  
  pfVar4 = lookup_ht(B,vt_hash);
  if (pfVar4 == (flatbuffers_uoffset_t *)0x0) {
    B_local._4_4_ = 0;
  }
  else {
    vt_._4_4_ = *pfVar4;
    pvd = (flatbuffers_uoffset_t *)0x0;
    pvd_head = pfVar4;
    while (vt_._4_4_ != 0) {
      pfVar5 = (flatbuffers_uoffset_t *)((long)B->buffers[6].iov_base + (ulong)vt_._4_4_);
      __s2 = (flatbuffers_voffset_t *)((long)B->buffers[2].iov_base + (ulong)pfVar5[2]);
      if ((*__s2 == vt_size) && (iVar2 = memcmp(vt,__s2,(ulong)vt_size), iVar2 == 0)) {
        if (pfVar5[1] == B->nest_id) {
          if (pvd_head != pfVar4) {
            *pvd_head = pfVar5[3];
            pfVar5[3] = *pfVar4;
            *pfVar4 = vt_._4_4_;
          }
          return *pfVar5;
        }
        pvd_head = pfVar5 + 3;
        vt_._4_4_ = pfVar5[3];
        pvd = pfVar5;
      }
      else {
        pvd_head = pfVar5 + 3;
        vt_._4_4_ = pfVar5[3];
      }
    }
    pfVar6 = (flatcc_builder_vt_ref_t *)reserve_buffer(B,6,(ulong)B->vd_end,0x10,0);
    if (pfVar6 == (flatcc_builder_vt_ref_t *)0x0) {
      B_local._4_4_ = 0;
    }
    else {
      fVar1 = B->vd_end;
      B->vd_end = B->vd_end + 0x10;
      pfVar6[1] = B->nest_id;
      pfVar6[3] = *pfVar4;
      *pfVar4 = fVar1;
      fVar3 = flatcc_builder_create_vtable(B,vt,vt_size);
      *pfVar6 = fVar3;
      if (fVar3 == 0) {
        B_local._4_4_ = 0;
      }
      else {
        if (pvd == (flatbuffers_uoffset_t *)0x0) {
          if ((B->vb_flush_limit == 0) || ((ulong)(B->vb_end + (uint)vt_size) <= B->vb_flush_limit))
          {
            __dest = reserve_buffer(B,2,(ulong)B->vb_end,(ulong)vt_size,0);
            if (__dest == (void *)0x0) {
              return -1;
            }
            pfVar6[2] = B->vb_end;
            B->vb_end = (uint)vt_size + B->vb_end;
            memcpy(__dest,vt,(ulong)vt_size);
          }
          else {
            flatcc_builder_flush_vtable_cache(B);
          }
        }
        else {
          pfVar6[2] = pvd[2];
        }
        B_local._4_4_ = *pfVar6;
      }
    }
  }
  return B_local._4_4_;
}

Assistant:

flatcc_builder_vt_ref_t flatcc_builder_create_cached_vtable(flatcc_builder_t *B,
        const voffset_t *vt, voffset_t vt_size, uint32_t vt_hash)
{
    vtable_descriptor_t *vd, *vd2;
    uoffset_t *pvd, *pvd_head;
    uoffset_t next;
    voffset_t *vt_;

    /* This just gets the hash table slot, we still have to inspect it. */
    if (!(pvd_head = lookup_ht(B, vt_hash))) {
        return 0;
    }
    pvd = pvd_head;
    next = *pvd;
    /* Tracks if there already is a cached copy. */
    vd2 = 0;
    while (next) {
        vd = vd_ptr(next);
        vt_ = vb_ptr(vd->vb_start);
        if (vt_[0] != vt_size || 0 != memcmp(vt, vt_, vt_size)) {
            pvd = &vd->next;
            next = vd->next;
            continue;
        }
        /* Can't share emitted vtables between buffers, */
        if (vd->nest_id != B->nest_id) {
            /* but we don't have to resubmit to cache. */
            vd2 = vd;
            /* See if there is a better match. */
            pvd = &vd->next;
            next = vd->next;
            continue;
        }
        /* Move to front hash strategy. */
        if (pvd != pvd_head) {
            *pvd = vd->next;
            vd->next = *pvd_head;
            *pvd_head = next;
        }
        /* vtable exists and has been emitted within current buffer. */
        return vd->vt_ref;
    }
    /* Allocate new descriptor. */
    if (!(vd = reserve_buffer(B, flatcc_builder_alloc_vd, B->vd_end, sizeof(vtable_descriptor_t), 0))) {
        return 0;
    }
    next = B->vd_end;
    B->vd_end += (uoffset_t)sizeof(vtable_descriptor_t);

    /* Identify the buffer this vtable descriptor belongs to. */
    vd->nest_id = B->nest_id;

    /* Move to front hash strategy. */
    vd->next = *pvd_head;
    *pvd_head = next;
    if (0 == (vd->vt_ref = flatcc_builder_create_vtable(B, vt, vt_size))) {
        return 0;
    }
    if (vd2) {
        /* Reuse cached copy. */
        vd->vb_start = vd2->vb_start;
    } else {
        if (B->vb_flush_limit && B->vb_flush_limit < B->vb_end + vt_size) {
            flatcc_builder_flush_vtable_cache(B);
        } else {
            /* Make space in vtable cache. */
            if (!(vt_ = reserve_buffer(B, flatcc_builder_alloc_vb, B->vb_end, vt_size, 0))) {
                return -1;
            }
            vd->vb_start = B->vb_end;
            B->vb_end += vt_size;
            memcpy(vt_, vt, vt_size);
        }
    }
    return vd->vt_ref;
}